

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_mod_m68k(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  int iVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  floatx80 fVar17;
  floatx80 fVar18;
  int32_t bExp;
  int32_t aExp;
  uint64_t bSig;
  uint64_t local_68;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  float_status *local_50;
  ulong local_48;
  uint64_t local_40;
  ulong local_38;
  
  local_40 = b.low;
  uVar13 = a._8_8_;
  fVar17.low = a.low;
  uVar9 = uVar13 & 0xffffffff;
  local_54 = a._8_4_ & 0x7fff;
  local_58 = b._8_4_ & 0x7fff;
  local_68 = fVar17.low;
  if ((~a._8_4_ & 0x7fff) == 0) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        local_58 != 0x7fff)) {
LAB_006ee0b5:
      float_raise_m68k('\x01',status);
      fVar17 = floatx80_default_nan_m68k(status);
      auVar1 = fVar17._0_12_;
    }
    else {
LAB_006eded1:
      fVar17._8_8_ = uVar13 & 0xffffffff;
      fVar17 = propagateFloatx80NaN_m68k(fVar17,b,status);
      auVar1 = fVar17._0_12_;
    }
  }
  else {
    if ((short)local_58 == 0) {
      if (local_40 == 0) goto LAB_006ee0b5;
      normalizeFloatx80Subnormal_m68k(local_40,(int32_t *)&local_58,&local_40);
    }
    else if (local_58 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_006ee25c;
      goto LAB_006eded1;
    }
    if (local_54 == 0) {
      if ((local_68 & 0x7fffffffffffffff) == 0) goto LAB_006ee25c;
      normalizeFloatx80Subnormal_m68k(local_68,(int32_t *)&local_54,&local_68);
    }
    uVar12 = local_40 | 0x8000000000000000;
    local_48 = (ulong)local_58;
    uVar3 = local_54 - local_58;
    if ((int)uVar3 < 0) goto LAB_006ee25c;
    if (uVar12 <= local_68) {
      local_68 = local_68 - uVar12;
    }
    uVar9 = (uVar13 & 0xffff) >> 0xf;
    iVar4 = uVar3 - 0x40;
    local_5c = (undefined4)uVar9;
    if (uVar3 < 0x41) {
      fVar17.low = 0;
    }
    else {
      uVar14 = uVar12 >> 0x20;
      uVar13 = local_40 & 0xffffffff00000000 | 0x8000000000000000;
      local_38 = local_40;
      fVar17.low = 0;
      iVar2 = iVar4;
      do {
        uVar7 = 0xffffffffffffffff;
        if (local_68 < uVar12) {
          uVar6 = 0xffffffff00000000;
          if (local_68 < uVar13) {
            uVar6 = local_68 / uVar14 << 0x20;
          }
          uVar10 = (uVar6 >> 0x20) * (local_40 & 0xffffffff);
          uVar11 = uVar6 * uVar12;
          uVar7 = fVar17.low - uVar11;
          for (lVar8 = ((local_68 - ((uVar10 >> 0x20) + uVar14 * (uVar6 >> 0x20))) -
                       (ulong)(fVar17.low < uVar11)) - (ulong)(uVar11 < uVar10 << 0x20); lVar8 < 0;
              lVar8 = lVar8 + uVar14 + (ulong)bVar16) {
            uVar6 = uVar6 - 0x100000000;
            bVar16 = CARRY8(uVar7,local_40 << 0x20);
            uVar7 = uVar7 + (local_40 << 0x20);
          }
          uVar10 = uVar7 >> 0x20 | lVar8 << 0x20;
          uVar7 = 0xffffffff;
          if (uVar10 < uVar13) {
            uVar7 = uVar10 / uVar14;
          }
          uVar7 = uVar7 | uVar6;
        }
        uVar6 = 0;
        if (1 < uVar7) {
          uVar6 = uVar7 - 2;
        }
        lVar8 = (uVar6 & 0xffffffff) * uVar14 + (uVar6 >> 0x20) * (local_40 & 0xffffffff);
        uVar7 = uVar6 * uVar12;
        local_68 = (ulong)((((int)local_68 - (uint)(fVar17.low < uVar7)) -
                           ((int)((ulong)lVar8 >> 0x20) +
                           (int)(uVar6 >> 0x20) * (int)(uVar12 >> 0x20))) -
                          (uint)(uVar7 < (ulong)(lVar8 << 0x20))) << 0x3e | fVar17.low + -uVar7 >> 2
        ;
        fVar17.low = -uVar7 << 0x3e;
        iVar4 = iVar2 + -0x3e;
        bVar16 = 0x3e < iVar2;
        iVar2 = iVar4;
        local_50 = status;
      } while (bVar16);
    }
    if (-0x40 < iVar4) {
      uVar13 = uVar12 >> 0x20;
      if (local_68 < uVar12) {
        uVar6 = local_40 & 0xffffffff00000000 | 0x8000000000000000;
        uVar7 = 0xffffffff00000000;
        if (local_68 < uVar6) {
          uVar7 = local_68 / uVar13 << 0x20;
        }
        uVar11 = (uVar7 >> 0x20) * (local_40 & 0xffffffff);
        uVar10 = uVar7 * uVar12;
        uVar14 = fVar17.low - uVar10;
        lVar8 = ((local_68 - ((uVar11 >> 0x20) + (uVar7 >> 0x20) * uVar13)) -
                (ulong)(fVar17.low < uVar10)) - (ulong)(uVar10 < uVar11 << 0x20);
        if (lVar8 < 0) {
          do {
            uVar7 = uVar7 - 0x100000000;
            bVar16 = CARRY8(uVar14,local_40 << 0x20);
            uVar14 = uVar14 + (local_40 << 0x20);
            lVar8 = lVar8 + uVar13 + (ulong)bVar16;
          } while (lVar8 < 0);
        }
        uVar10 = uVar14 >> 0x20 | lVar8 << 0x20;
        uVar14 = 0xffffffff;
        if (uVar10 < uVar6) {
          uVar14 = uVar10 / uVar13;
        }
        uVar14 = uVar14 | uVar7;
        local_50 = status;
      }
      else {
        uVar14 = 0xffffffffffffffff;
      }
      uVar6 = 0;
      uVar7 = uVar14 - 2;
      if (uVar14 < 2) {
        uVar7 = uVar6;
      }
      bVar5 = -(byte)iVar4;
      uVar7 = (uVar7 >> (bVar5 & 0x3f)) << (bVar5 & 0x3f);
      uVar15 = (local_40 & 0xffffffff) * (uVar7 >> 0x20);
      uVar10 = (uVar7 & 0xffffffff) * uVar13;
      uVar11 = uVar10 + uVar15;
      uVar14 = 0xffffffff00000000;
      if (!CARRY8(uVar10,uVar15)) {
        uVar14 = uVar6;
      }
      uVar10 = uVar7 * uVar12;
      bVar16 = fVar17.low < uVar10;
      fVar17.low = fVar17.low - uVar10;
      local_68 = (((local_68 - bVar16) - ((uVar11 >> 0x20) + (uVar7 >> 0x20) * uVar13)) + uVar14) -
                 (ulong)(uVar10 < uVar11 << 0x20);
      uVar14 = uVar12 << (bVar5 & 0x3f);
      uVar13 = uVar12 >> ((byte)iVar4 & 0x3f);
      if (iVar4 == 0) {
        uVar13 = uVar6;
      }
      if ((uVar13 < local_68) || (uVar14 <= fVar17.low && uVar13 == local_68)) {
        do {
          do {
            uVar7 = fVar17.low - uVar14;
            bVar16 = fVar17.low < uVar14;
            fVar17.low = fVar17.low - uVar14;
            local_68 = (local_68 - uVar13) - (ulong)bVar16;
          } while (uVar13 < local_68);
        } while (uVar14 <= uVar7 && uVar13 == local_68);
      }
    }
    local_40 = uVar12;
    fVar17 = normalizeRoundAndPackFloatx80_m68k
                       ('P',(flag)uVar9,local_58 + iVar4 + 0x40,local_68,fVar17.low,status);
    auVar1 = fVar17._0_12_;
  }
  fVar17.low = auVar1._0_8_;
  uVar9 = (ulong)auVar1._8_4_;
LAB_006ee25c:
  fVar18._8_8_ = uVar9;
  fVar18.low = fVar17.low;
  return fVar18;
}

Assistant:

floatx80 floatx80_mod(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t qTemp, term0, term1;

    aSig0 = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);
    bSig = extractFloatx80Frac(b);
    bExp = extractFloatx80Exp(b);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig0 << 1)
            || ((bExp == 0x7FFF) && (uint64_t) (bSig << 1))) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if (bExp == 0x7FFF) {
        if ((uint64_t) (bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if (bExp == 0) {
        if (bSig == 0) {
        invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal(bSig, &bExp, &bSig);
    }
    if (aExp == 0) {
        if ((uint64_t) (aSig0 << 1) == 0) {
            return a;
        }
        normalizeFloatx80Subnormal(aSig0, &aExp, &aSig0);
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if (expDiff < 0) {
        return a;
    }
    qTemp = (bSig <= aSig0);
    if (qTemp) {
        aSig0 -= bSig;
    }
    expDiff -= 64;
    while (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        mul64To128(bSig, qTemp, &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(aSig0, aSig1, 62, &aSig0, &aSig1);
        expDiff -= 62;
    }
    expDiff += 64;
    if (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        qTemp >>= 64 - expDiff;
        mul64To128(bSig, qTemp << (64 - expDiff), &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(0, bSig, 64 - expDiff, &term0, &term1);
        while (le128(term0, term1, aSig0, aSig1)) {
            ++qTemp;
            sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        }
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);
}